

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-close.c
# Opt level: O2

int run_test_loop_close(void)

{
  int iVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_loop_t loop;
  
  loop.data = &loop;
  iVar1 = uv_loop_init(&loop);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    if ((uv_loop_t *)loop.data != &loop) {
      uVar4 = 0x27;
      goto LAB_00153801;
    }
    uv_timer_init(&loop,&timer_handle);
    uv_timer_start(&timer_handle,timer_cb,100,100);
    eval_a = -0x10;
    iVar1 = uv_loop_close(&loop);
    eval_b = (int64_t)iVar1;
    if (eval_b == -0x10) {
      uv_run(&loop,UV_RUN_DEFAULT);
      uv_close((uv_handle_t *)&timer_handle,(uv_close_cb)0x0);
      iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        if ((uv_loop_t *)loop.data == &loop) {
          iVar1 = uv_loop_close(&loop);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a != 0) {
            pcVar3 = "0";
            pcVar2 = "uv_loop_close(&loop)";
            uVar4 = 0x35;
            goto LAB_001537c2;
          }
          if ((uv_loop_t *)loop.data == &loop) {
            return 0;
          }
          uVar4 = 0x36;
        }
        else {
          uVar4 = 0x34;
        }
LAB_00153801:
        eval_b = (int64_t)&loop;
        pcVar2 = "loop.data";
        __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
        pcVar3 = "(void*) &loop";
        eval_a = (int64_t)loop.data;
        goto LAB_0015380b;
      }
      pcVar3 = "0";
      pcVar2 = "r";
      uVar4 = 0x32;
    }
    else {
      pcVar3 = "uv_loop_close(&loop)";
      pcVar2 = "UV_EBUSY";
      uVar4 = 0x2c;
    }
  }
  else {
    pcVar3 = "0";
    pcVar2 = "uv_loop_init(&loop)";
    uVar4 = 0x26;
  }
LAB_001537c2:
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
LAB_0015380b:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-close.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(loop_close) {
  int r;
  uv_loop_t loop;

  loop.data = &loop;
  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_PTR_EQ(loop.data, (void*) &loop);

  uv_timer_init(&loop, &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  ASSERT_EQ(UV_EBUSY, uv_loop_close(&loop));

  uv_run(&loop, UV_RUN_DEFAULT);

  uv_close((uv_handle_t*) &timer_handle, NULL);
  r = uv_run(&loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_PTR_EQ(loop.data, (void*) &loop);
  ASSERT_OK(uv_loop_close(&loop));
  ASSERT_PTR_EQ(loop.data, (void*) &loop);

  return 0;
}